

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

int lgx_type_inference(lgx_type_t *src,lgx_type_t *dst)

{
  lgx_val_type_t lVar1;
  int iVar2;
  
  while( true ) {
    for (; lVar1 = dst->type, lVar1 == T_ARRAY; dst = &((dst->u).arr)->value) {
      if (src->type != T_ARRAY) {
        return 1;
      }
      src = &((src->u).arr)->value;
    }
    if (lVar1 != T_MAP) {
      if (lVar1 != T_UNKNOWN) {
        iVar2 = lgx_type_cmp(src,dst);
        return iVar2;
      }
      iVar2 = lgx_type_dup(src,dst);
      return iVar2;
    }
    if (src->type != T_MAP) {
      return 1;
    }
    iVar2 = lgx_type_inference(&((src->u).arr)->value,&((dst->u).arr)->value);
    if (iVar2 != 0) break;
    src = (lgx_type_t *)&((src->u).sru)->methods;
    dst = (lgx_type_t *)&((dst->u).sru)->methods;
  }
  return 1;
}

Assistant:

int lgx_type_inference(lgx_type_t* src, lgx_type_t* dst) {
    switch (dst->type) {
        case T_UNKNOWN:
            return lgx_type_dup(src, dst);
        case T_ARRAY:
            if (src->type != T_ARRAY) {
                return 1;
            }
            return lgx_type_inference(&src->u.arr->value, &dst->u.arr->value);
        case T_MAP:
            if (src->type != T_MAP) {
                return 1;
            }
            if (lgx_type_inference(&src->u.map->key, &dst->u.map->key)) {
                return 1;
            }
            return lgx_type_inference(&src->u.map->value, &dst->u.map->value);
        default:
            return lgx_type_cmp(src, dst);
    }
}